

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O2

uint8_t get_superres_denom_for_qindex(AV1_COMP *cpi,int qindex,int sr_kf,int sr_arf)

{
  FRAME_UPDATE_TYPE FVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  AV1_PRIMARY *pAVar5;
  YV12_BUFFER_CONFIG *pYVar6;
  uint8_t *puVar7;
  int k;
  int iVar8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  double *pdVar12;
  long lVar13;
  byte bVar14;
  int j_1;
  ulong uVar15;
  int iVar16;
  long lVar17;
  int j;
  long lVar18;
  double dVar19;
  double dVar20;
  long local_238 [16];
  double energy [16];
  int32_t coeff [64];
  
  pAVar5 = cpi->ppi;
  FVar1 = (pAVar5->gf_group).update_type[cpi->gf_frame_index];
  if ((FVar1 == '\x03') || (bVar10 = 8, FVar1 == '\0')) {
    pYVar6 = cpi->source;
    iVar8 = (cpi->td).mb.e_mbd.bd;
    iVar2 = (pYVar6->field_2).field_0.y_crop_width;
    iVar3 = (pYVar6->field_3).field_0.y_crop_height;
    local_238[0] = 0;
    local_238[1] = 0;
    local_238[2] = 0;
    local_238[3] = 0;
    local_238[4] = 0;
    local_238[5] = 0;
    local_238[6] = 0;
    local_238[7] = 0;
    local_238[8] = 0;
    local_238[9] = 0;
    local_238[10] = 0;
    local_238[0xb] = 0;
    local_238[0xc] = 0;
    local_238[0xd] = 0;
    local_238[0xe] = 0;
    local_238[0xf] = 0;
    if ((pYVar6->flags & 8) == 0) {
      iVar16 = 0;
      for (uVar15 = 0; (long)uVar15 < (long)iVar3 + -4; uVar15 = uVar15 + 4) {
        for (lVar18 = 0; lVar18 < iVar2 + -0x10; lVar18 = lVar18 + 0x10) {
          uVar9 = uVar15 & 0xffffffff;
          pdVar12 = energy;
          for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
            for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
              *(ushort *)((long)pdVar12 + lVar17 * 2) =
                   (ushort)(pYVar6->field_5).buffers[0]
                           [(pYVar6->field_4).field_0.y_stride * (int)uVar9 + (int)lVar18 +
                            (int)lVar17];
            }
            pdVar12 = pdVar12 + 4;
            uVar9 = (ulong)((int)uVar9 + 1);
          }
          (*av1_fwd_txfm2d_16x4)((int16_t *)energy,coeff,0x10,'\v',iVar8);
          for (lVar13 = 0; lVar13 != 0xf; lVar13 = lVar13 + 1) {
            local_238[lVar13 + 1] =
                 local_238[lVar13 + 1] +
                 ((long)coeff[lVar13 + 0x21] * (long)coeff[lVar13 + 0x21] +
                  (long)coeff[lVar13 + 0x11] * (long)coeff[lVar13 + 0x11] +
                  (long)coeff[lVar13 + 1] * (long)coeff[lVar13 + 1] +
                  (long)coeff[lVar13 + 0x31] * (long)coeff[lVar13 + 0x31] + 2U >> 2);
          }
          iVar16 = iVar16 + 1;
        }
      }
    }
    else {
      puVar7 = (pYVar6->field_5).field_0.y_buffer;
      bVar10 = (char)iVar8 * '\x02' - 0xe;
      iVar16 = 0;
      for (iVar11 = 0; iVar11 < iVar3 + -4; iVar11 = iVar11 + 4) {
        for (lVar18 = 0; lVar18 < (long)iVar2 + -0x10; lVar18 = lVar18 + 0x10) {
          iVar4 = (pYVar6->field_4).field_0.y_stride;
          (*av1_fwd_txfm2d_16x4)
                    ((int16_t *)((long)puVar7 * 2 + (long)(iVar4 * iVar11) * 2 + lVar18 * 2),coeff,
                     iVar4,'\v',iVar8);
          for (lVar13 = 0; lVar13 != 0xf; lVar13 = lVar13 + 1) {
            local_238[lVar13 + 1] =
                 local_238[lVar13 + 1] +
                 ((long)coeff[lVar13 + 0x31] * (long)coeff[lVar13 + 0x31] +
                  (long)coeff[lVar13 + 0x21] * (long)coeff[lVar13 + 0x21] +
                  (long)coeff[lVar13 + 0x11] * (long)coeff[lVar13 + 0x11] +
                  (long)coeff[lVar13 + 1] * (long)coeff[lVar13 + 1] +
                  (ulong)((uint)(1 << (bVar10 & 0x1f)) >> 1) >> (bVar10 & 0x3f));
          }
          iVar16 = iVar16 + 1;
        }
      }
    }
    if (iVar16 == 0) {
      for (lVar18 = 1; lVar18 != 0x10; lVar18 = lVar18 + 1) {
        energy[lVar18] = 1e+20;
      }
    }
    else {
      for (lVar18 = 1; lVar18 != 0x10; lVar18 = lVar18 + 1) {
        energy[lVar18] =
             (((double)CONCAT44(0x45300000,(int)((ulong)local_238[lVar18] >> 0x20)) -
              1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_238[lVar18]) - 4503599627370496.0)) /
             (double)iVar16;
      }
      lVar18 = 0xe;
      while (lVar18 != 0) {
        energy[lVar18] = energy[lVar18 + 1] + energy[lVar18];
        lVar18 = lVar18 + -1;
      }
    }
    FVar1 = (pAVar5->gf_group).update_type[cpi->gf_frame_index];
    if (FVar1 == '\x03') {
      dVar19 = 0.008;
    }
    else if (FVar1 == '\0') {
      dVar19 = *(double *)(&DAT_0045d940 + (ulong)((cpi->rc).frames_to_key < 2) * 8);
    }
    else {
      dVar19 = 0.0;
    }
    dVar20 = av1_convert_qindex_to_q(qindex,AOM_BITS_8);
    dVar20 = dVar19 * dVar20 * dVar20;
    if (energy[1] * 0.2 <= dVar20) {
      dVar20 = energy[1] * 0.2;
    }
    bVar14 = 8;
    for (uVar15 = 0x10; 8 < uVar15; uVar15 = uVar15 - 1) {
      if (dVar20 < energy[uVar15 - 1]) goto LAB_00206293;
      bVar14 = bVar14 + 1;
    }
    bVar14 = 0x10;
LAB_00206293:
    iVar8 = av1_superres_in_recode_allowed(cpi);
    bVar10 = 9;
    if (9 < bVar14) {
      bVar10 = bVar14;
    }
    if (iVar8 == 0) {
      bVar10 = bVar14;
    }
  }
  return bVar10;
}

Assistant:

static uint8_t get_superres_denom_for_qindex(const AV1_COMP *cpi, int qindex,
                                             int sr_kf, int sr_arf) {
  // Use superres for Key-frames and Alt-ref frames only.
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  if (gf_group->update_type[cpi->gf_frame_index] != KF_UPDATE &&
      gf_group->update_type[cpi->gf_frame_index] != ARF_UPDATE) {
    return SCALE_NUMERATOR;
  }
  if (gf_group->update_type[cpi->gf_frame_index] == KF_UPDATE && !sr_kf) {
    return SCALE_NUMERATOR;
  }
  if (gf_group->update_type[cpi->gf_frame_index] == ARF_UPDATE && !sr_arf) {
    return SCALE_NUMERATOR;
  }

  double energy[16];
  analyze_hor_freq(cpi, energy);

  const double energy_by_q2_thresh =
      get_energy_by_q2_thresh(gf_group, &cpi->rc, cpi->gf_frame_index);
  int denom = get_superres_denom_from_qindex_energy(
      qindex, energy, energy_by_q2_thresh, SUPERRES_ENERGY_BY_AC_THRESH);
  /*
  printf("\nenergy = [");
  for (int k = 1; k < 16; ++k) printf("%f, ", energy[k]);
  printf("]\n");
  printf("boost = %d\n",
         (gf_group->update_type[cpi->gf_frame_index] == KF_UPDATE)
             ? cpi->ppi->p_rc.kf_boost
             : cpi->rc.gfu_boost);
  printf("denom = %d\n", denom);
  */
  if (av1_superres_in_recode_allowed(cpi)) {
    assert(cpi->superres_mode != AOM_SUPERRES_NONE);
    // Force superres to be tried in the recode loop, as full-res is also going
    // to be tried anyway.
    denom = AOMMAX(denom, SCALE_NUMERATOR + 1);
  }
  return denom;
}